

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safeint-test.cc
# Opt level: O0

void __thiscall SafeIntTest_Ctor_Test::TestBody(SafeIntTest_Ctor_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  AssertHelper *this_00;
  AssertionResult gtest_ar_1;
  OverflowError *anon_var_0;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  AssertionResult gtest_ar;
  SafeInt<int> n;
  AssertHelper *in_stack_ffffffffffffff20;
  int *in_stack_ffffffffffffff28;
  AssertionResult *this_01;
  undefined6 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff36;
  undefined1 in_stack_ffffffffffffff37;
  char *in_stack_ffffffffffffff38;
  int line;
  AssertionResult *this_02;
  undefined4 in_stack_ffffffffffffff4c;
  Type type;
  AssertHelper *in_stack_ffffffffffffff50;
  SafeInt<int> local_9c;
  AssertionResult local_90 [2];
  Message *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  byte in_stack_ffffffffffffffa7;
  ConstCharPtr local_58 [5];
  int local_2c;
  int local_28;
  undefined4 local_24;
  AssertionResult local_20;
  SafeInt<int> local_c [3];
  
  mp::SafeInt<int>::SafeInt(local_c,0x2a);
  local_24 = 0x2a;
  local_2c = local_c[0].value_;
  local_28 = mp::val(local_c[0]);
  this_02 = &local_20;
  testing::internal::EqHelper<false>::Compare<int,int>
            (in_stack_ffffffffffffff38,
             (char *)CONCAT17(in_stack_ffffffffffffff37,
                              CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)),
             in_stack_ffffffffffffff28,(int *)in_stack_ffffffffffffff20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_02);
  type = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff4c);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff50);
    in_stack_ffffffffffffff38 =
         testing::AssertionResult::failure_message((AssertionResult *)0x10b071);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff50,type,&this_02->success_,
               (int)((ulong)in_stack_ffffffffffffff38 >> 0x20),
               (char *)CONCAT17(in_stack_ffffffffffffff37,
                                CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff98);
    testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff20);
    testing::Message::~Message((Message *)0x10b0ce);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10b123);
  testing::internal::ConstCharPtr::ConstCharPtr(local_58,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool(local_58);
  if (bVar1) {
    in_stack_ffffffffffffffa7 = 0;
    in_stack_ffffffffffffff37 = testing::internal::AlwaysTrue();
    if ((bool)in_stack_ffffffffffffff37) {
      mp::SafeInt<int>::SafeInt<unsigned_int>
                ((SafeInt<int> *)this_02,(uint)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    }
    if ((in_stack_ffffffffffffffa7 & 1) != 0) goto LAB_0010b2c6;
    local_58[0].value =
         "Expected: SafeInt<int>(2147483647 + 1u) throws an exception of type OverflowError.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message((Message *)in_stack_ffffffffffffff50);
  testing::internal::AssertHelper::AssertHelper
            (in_stack_ffffffffffffff50,type,&this_02->success_,
             (int)((ulong)in_stack_ffffffffffffff38 >> 0x20),
             (char *)CONCAT17(in_stack_ffffffffffffff37,
                              CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)));
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
             in_stack_ffffffffffffff98);
  testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff20);
  testing::Message::~Message((Message *)0x10b281);
LAB_0010b2c6:
  mp::SafeInt<int>::SafeInt<unsigned_int>
            ((SafeInt<int> *)this_02,(uint)((ulong)in_stack_ffffffffffffff38 >> 0x20));
  mp::val(local_9c);
  this_01 = local_90;
  testing::internal::EqHelper<false>::Compare<int,int>
            (in_stack_ffffffffffffff38,
             (char *)CONCAT17(in_stack_ffffffffffffff37,
                              CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)),
             (int *)this_01,(int *)in_stack_ffffffffffffff20);
  line = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(this_01);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff50);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x10b35f)
    ;
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff50,type,&this_02->success_,line,
               (char *)CONCAT17(in_stack_ffffffffffffff37,CONCAT16(uVar2,in_stack_ffffffffffffff30))
              );
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff98);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x10b3ad);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10b3f9);
  return;
}

Assistant:

TEST(SafeIntTest, Ctor) {
  SafeInt<int> n(42);
  EXPECT_EQ(42, val(n));
  EXPECT_THROW(SafeInt<int>(INT_MAX + 1u), OverflowError);
  EXPECT_EQ(42, val(SafeInt<int>(42u)));
}